

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Def_AST_Node::eval_internal(Def_AST_Node *this,Dispatch_State *t_ss)

{
  Dispatch_Engine *pDVar1;
  long lVar2;
  long lVar3;
  Conversion_Saves *pCVar4;
  Stack_Holder *pSVar5;
  Dispatch_Engine *this_00;
  element_type *peVar6;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar7;
  __shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *this_01;
  Boxed_Value BVar8;
  AST_NodePtr guardnode;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> guard;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_param_names;
  Param_Types param_types;
  __shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> local_148;
  undefined1 local_138 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  Proxy_Function local_f8 [2];
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  element_type *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88 [8];
  Param_Types local_68;
  
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_ptr = (element_type *)0x0;
  local_148._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_68._17_8_ = 0;
  local_68.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_68.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_68.m_doti.m_type_info = (type_info *)&chaiscript::dispatch::Dynamic_Object::typeinfo;
  local_68.m_doti.m_bare_type_info = (type_info *)&chaiscript::dispatch::Dynamic_Object::typeinfo;
  local_68.m_doti.m_flags = 0;
  pDVar1 = t_ss[3].m_engine._M_data;
  if ((ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar1) < 0x21) {
    iVar7 = 0;
  }
  else {
    lVar2 = *(long *)((long)&(pDVar1->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10);
    this_01 = (__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(pDVar1->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10);
    if (*(int *)(lVar2 + 0x18) == 8) {
      lVar3 = *(long *)(lVar2 + 0x68);
      lVar2 = *(long *)(lVar2 + 0x60);
      Arg_List_AST_Node::get_arg_names_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138,(Arg_List_AST_Node *)this_01,(AST_NodePtr *)in_RDX);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_c8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      Arg_List_AST_Node::get_arg_types
                ((Param_Types *)local_138,
                 (AST_NodePtr *)
                 ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                         _M_mutex + 0x10),in_RDX);
      iVar7 = (int)(lVar3 - lVar2 >> 4);
      chaiscript::dispatch::Param_Types::operator=(&local_68,(Param_Types *)local_138);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                 *)local_138);
      pDVar1 = t_ss[3].m_engine._M_data;
      if ((ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar1) < 0x31) goto LAB_00198f10;
      this_01 = (__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)
                &(pDVar1->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next;
    }
    else {
      iVar7 = 0;
    }
    std::__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_148,this_01);
  }
LAB_00198f10:
  pDVar1 = (in_RDX->m_engine)._M_data;
  local_d8._M_ptr = (element_type *)0x0;
  local_d8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_148._M_ptr != (element_type *)0x0) {
    local_138._0_8_ = pDVar1;
    std::__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
               &local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_138 + 0x18),&local_c8);
    local_f8[0].
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ._0_4_ = iVar7;
    make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_>,chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_1_,int,std::shared_ptr<chaiscript::AST_Node>&>
              ((chaiscript *)&local_a8,(anon_class_48_3_accba683_for_m_f *)local_138,(int *)local_f8
               ,(shared_ptr<chaiscript::AST_Node> *)&local_148);
    std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&local_d8,
              (__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2> *
              )&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    const::
    {lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)#1}::
    ~vector((_lambda_std__vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const___1_
             *)local_138);
  }
  lVar2 = ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.__align;
  pCVar4 = t_ss[3].m_conversions.m_saves._M_data;
  local_b0 = (element_type *)this;
  if (pCVar4 == (Conversion_Saves *)0x0) {
    std::__cxx11::string::string((string *)&local_a8,"",(allocator *)local_138);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,(string *)(pCVar4 + 1));
  }
  pSVar5 = t_ss[3].m_stack_holder._M_data;
  this_00 = (in_RDX->m_engine)._M_data;
  local_138._0_8_ = pDVar1;
  std::__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
             &local_148);
  std::__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x18),
             (__shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2> *)
             &pSVar5[-1].call_params.
              super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,&local_c8);
  local_88[0] = iVar7;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_2_>,chaiscript::eval::Def_AST_Node::eval_internal(chaiscript::detail::Dispatch_State_const&)const::_lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)_2_,int,std::shared_ptr<chaiscript::AST_Node>const&,chaiscript::dispatch::Param_Types&,std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>&>
            ((chaiscript *)local_f8,(anon_class_64_4_816528dd_for_m_f *)local_138,local_88,
             (shared_ptr<chaiscript::AST_Node> *)
             &t_ss[3].m_stack_holder._M_data[-1].call_params.
              super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_68,&local_a8,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_d8);
  peVar6 = local_b0;
  chaiscript::detail::Dispatch_Engine::add(this_00,local_f8,(string *)(lVar2 + 0x20));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8[0].
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  const::
  {lambda(std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const&)#2}::
  ~vector((_lambda_std__vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>const___2_
           *)local_138);
  std::__cxx11::string::~string((string *)&local_a8);
  Boxed_Value::Object_Data::get();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_68.m_types);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          std::vector<std::string> t_param_names;
          size_t numparams = 0;
          AST_NodePtr guardnode;

          dispatch::Param_Types param_types;

          if ((this->children.size() > 2) && (this->children[1]->identifier == AST_Node_Type::Arg_List)) {
            numparams = this->children[1]->children.size();
            t_param_names = Arg_List_AST_Node::get_arg_names(this->children[1]);
            param_types = Arg_List_AST_Node::get_arg_types(this->children[1], t_ss);

            if (this->children.size() > 3) {
              guardnode = this->children[2];
            }
          }
          else {
            //no parameters
            numparams = 0;

            if (this->children.size() > 2) {
              guardnode = this->children[1];
            }
          }

          std::reference_wrapper<chaiscript::detail::Dispatch_Engine> engine(*t_ss);
          std::shared_ptr<dispatch::Proxy_Function_Base> guard;
          if (guardnode) {
            guard = dispatch::make_dynamic_proxy_function(
                [engine, guardnode, t_param_names](const std::vector<Boxed_Value> &t_params)
                {
                  return detail::eval_function(engine, guardnode, t_param_names, t_params);
                },
                static_cast<int>(numparams), guardnode);
          }

          try {
            const std::string & l_function_name = this->children[0]->text;
            const std::string & l_annotation = this->annotation?this->annotation->text:"";
            const auto & func_node = this->children.back();
            t_ss->add(
                dispatch::make_dynamic_proxy_function(
                  [engine, guardnode, func_node, t_param_names](const std::vector<Boxed_Value> &t_params)
                  {
                    return detail::eval_function(engine, func_node, t_param_names, t_params);
                  },
                  static_cast<int>(numparams), this->children.back(),
                  param_types, l_annotation, guard), l_function_name);
          }
          catch (const exception::reserved_word_error &e) {
            throw exception::eval_error("Reserved word used as function name '" + e.word() + "'");
          } catch (const exception::name_conflict_error &e) {
            throw exception::eval_error("Function redefined '" + e.name() + "'");
          }
          return Boxed_Value();
        }